

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O3

int __thiscall dic::dictDelete(dic *this,int dictidx,void *key)

{
  int iVar1;
  undefined8 *puVar2;
  rlist *this_00;
  listNode *plVar3;
  undefined8 *puVar4;
  void *pvVar5;
  long lVar6;
  
  iVar1 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.super__Vector_impl_data
          ._M_start[dictidx].rehashidx;
  puVar4 = (undefined8 *)dict_find(this,dictidx,0,key);
  if (iVar1 == -1) {
    if (puVar4 == (undefined8 *)0x0) {
      return -1;
    }
    puVar2 = (undefined8 *)*puVar4;
    if ((puVar2 != (undefined8 *)0x0) && ((undefined8 *)*puVar2 != puVar2 + 2)) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
    *puVar4 = 0;
    this_00 = (rlist *)puVar4[1];
    iVar1 = *(int *)&this_00->rl;
    if (iVar1 == 2) {
      plVar3 = this_00[-1].view;
      if (plVar3 != (listNode *)0x0) {
        pvVar5 = (void *)((long)this_00 + (long)plVar3 * 0x20 + -0x10);
        lVar6 = (long)plVar3 * -0x20;
        do {
          if (pvVar5 != *(void **)((long)pvVar5 + -0x10)) {
            operator_delete(*(void **)((long)pvVar5 + -0x10));
          }
          pvVar5 = (void *)((long)pvVar5 + -0x20);
          lVar6 = lVar6 + 0x20;
        } while (lVar6 != 0);
      }
      operator_delete__(&this_00[-1].view);
    }
    else if (iVar1 == 1) {
      rlist::listDel(this_00);
    }
    else if (iVar1 == 0) {
      if (this_00->rl != (Rlist *)&this_00->view) {
        operator_delete(this_00->rl);
      }
      operator_delete(this_00);
    }
  }
  else if (puVar4 == (undefined8 *)0x0) {
    pvVar5 = dict_find(this,dictidx,1,key);
    if (pvVar5 == (void *)0x0) {
      return -1;
    }
    operator_delete(pvVar5);
    return 1;
  }
  operator_delete(puVar4);
  return 1;
}

Assistant:

int dic::dictDelete(int dictidx,void *key){
    dictEntry *delEntry=NULL;
    if(dc[dictidx].rehashidx==-1){
        delEntry=(dictEntry *)dic::dict_find(dictidx,0,key);
        if(delEntry!=NULL){
            delete (std::string *)delEntry->key;
            delEntry->key=NULL;
            if(((robj *)delEntry->v.val)->objtype==_string)
            {
                delete (std::string *)delEntry->v.val;
            }else if(((robj *)delEntry->v.val)->objtype==_set){
                delete[] (std::string *)delEntry->v.val; 
            }else if(((robj *)delEntry->v.val)->objtype==_list){
                ((rlist *)delEntry->v.val)->listDel();
            }
            delEntry->v.val=NULL;
            delete delEntry;
            delEntry=NULL;
            return 1;
        }
    }else {
        delEntry=(dictEntry *)dic::dict_find(dictidx,0,key);
        if(delEntry!=NULL){
            delete delEntry;
            delEntry=NULL;
            return 1;
        }
        else if((delEntry=(dictEntry *)dic::dict_find(dictidx,1,key))!=NULL){
            if(delEntry!=NULL){
                delete delEntry;
                delEntry=NULL;
                return 1;
            } 
        }  
    }
    return -1;
}